

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

int __thiscall
event_track::ingest_event_stream::print_samples_from_file
          (ingest_event_stream *this,istream *infile,bool init_only)

{
  value_type vVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint32_t uVar5;
  ulong uVar6;
  pointer pbVar7;
  reference pbVar8;
  void *this_00;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  uchar *puVar12;
  ostream *poVar13;
  size_t in_RCX;
  void *__buf;
  exception e;
  DASHEventMessageBoxv1 e_1;
  string local_628;
  undefined1 local_608 [8];
  EventMessageInstanceBox im_box;
  string local_528;
  uint local_504;
  uint local_500;
  uint bts;
  uint j;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sample_data;
  int local_4d8;
  uint32_t ss;
  int i;
  uint32_t data_offset;
  uint64_t pres_time;
  undefined1 local_4b8 [7];
  bool mdat_found;
  media_fragment m;
  __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
  local_c8;
  iterator it;
  undefined1 local_b8 [8];
  box b;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> ingest_boxes;
  bool init_only_local;
  istream *infile_local;
  ingest_event_stream *this_local;
  
  bVar2 = std::ios::operator_cast_to_bool((ios *)(infile + *(long *)(*(long *)infile + -0x18)));
  if (bVar2) {
    std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::vector
              ((vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> *)&b.is_large_);
    do {
      bVar3 = std::ios::good();
      if ((bVar3 & 1) == 0) break;
      fmp4_stream::box::box((box *)local_b8);
      uVar6 = fmp4_stream::box::read((box *)local_b8,(int)infile,__buf,in_RCX);
      if ((uVar6 & 1) == 0) {
        it._M_current._4_4_ = 3;
      }
      else {
        std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::push_back
                  ((vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> *)&b.is_large_,
                   (value_type *)local_b8);
        iVar4 = std::__cxx11::string::compare((char *)&b.large_size_);
        if (iVar4 == 0) {
          it._M_current._4_4_ = 3;
        }
        else {
          it._M_current._4_4_ = 0;
        }
      }
      fmp4_stream::box::~box((box *)local_b8);
    } while (it._M_current._4_4_ == 0);
    local_c8._M_current =
         (box *)std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::begin
                          ((vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> *)
                           &b.is_large_);
    while( true ) {
      m.trun_.m_sentry.
      super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::end
                              ((vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> *)
                               &b.is_large_);
      bVar2 = __gnu_cxx::operator!=
                        (&local_c8,
                         (__normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                          *)&m.trun_.m_sentry.
                             super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar2) break;
      pbVar7 = __gnu_cxx::
               __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
               ::operator->(&local_c8);
      iVar4 = std::__cxx11::string::compare((char *)&pbVar7->box_type_);
      if (iVar4 == 0) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        fmp4_stream::box::operator=((box *)this,pbVar8);
      }
      pbVar7 = __gnu_cxx::
               __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
               ::operator->(&local_c8);
      iVar4 = std::__cxx11::string::compare((char *)&pbVar7->box_type_);
      if (iVar4 == 0) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        fmp4_stream::box::operator=(&(this->super_ingest_stream).init_fragment_.moov_box_,pbVar8);
        if (init_only) {
          this_local._4_4_ = 0;
          it._M_current._4_4_ = 1;
          goto LAB_0010cad6;
        }
      }
      pbVar7 = __gnu_cxx::
               __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
               ::operator->(&local_c8);
      iVar4 = std::__cxx11::string::compare((char *)&pbVar7->box_type_);
      if (iVar4 == 0) {
        fmp4_stream::box::box((box *)local_4b8);
        fmp4_stream::box::box((box *)&m.styp_.is_large_);
        m.prft_.is_large_ = false;
        m.prft_.has_uuid_ = false;
        m.prft_._98_6_ = 0;
        m.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        m.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::vector
                  ((vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_> *)
                   &m.prft_.is_large_);
        m.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        fmp4_stream::box::box((box *)&m.e_msg_is_in_mdat_);
        fmp4_stream::box::box((box *)&m.moof_box_.is_large_);
        m.mdat_box_.is_large_ = false;
        m.mdat_box_.has_uuid_ = false;
        m.mdat_box_._98_6_ = 0;
        m.trex_.track_id_ = 0;
        m.trex_.default_sample_description_index_ = 0;
        m.trex_.default_sample_duration_ = 0;
        fmp4_stream::mfhd::mfhd((mfhd *)&m.trex_.default_sample_flags_);
        fmp4_stream::tfhd::tfhd((tfhd *)&m.mfhd_.super_full_box.magic_conf_);
        fmp4_stream::tfdt::tfdt((tfdt *)&m.tfhd_.default_sample_size_);
        fmp4_stream::trun::trun((trun *)&m.tfdt_.base_media_decode_time_);
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        fmp4_stream::box::operator=((box *)&m.e_msg_is_in_mdat_,pbVar8);
        fmp4_stream::media_fragment::parse_moof((media_fragment *)local_4b8);
        poVar13 = std::operator<<((ostream *)&std::cout,
                                  "==  found movie fragment with base media decode time: ");
        this_00 = (void *)std::ostream::operator<<(poVar13,m.tfdt_.super_full_box._104_8_);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::
        __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
        ::operator++(&local_c8,0);
        if (((m.tfhd_.super_full_box.magic_conf_._2_1_ & 1) == 0) ||
           (m.trun_.super_full_box.magic_conf_ - 8 != (int)m.moof_box_._vptr_box)) {
          poVar13 = std::operator<<((ostream *)&std::cout,
                                    "error only CMAF based metadata tracks supported with default_base_is_moof and mdat immediately following"
                                   );
          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        }
        else {
          pbVar7 = __gnu_cxx::
                   __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                   ::operator->(&local_c8);
          iVar4 = std::__cxx11::string::compare((char *)&pbVar7->box_type_);
          if (iVar4 == 0) {
            pbVar8 = __gnu_cxx::
                     __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                     ::operator*(&local_c8);
            fmp4_stream::box::operator=((box *)&m.moof_box_.is_large_,pbVar8);
            _i = m.tfdt_.super_full_box._104_8_;
            ss = 0;
            if (((m.trun_.data_offset_._2_1_ & 1) != 0) && ((m.trun_.data_offset_._3_1_ & 1) != 0))
            {
              for (local_4d8 = 0;
                  sVar9 = std::
                          vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                          ::size((vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                  *)&m.trun_.data_offset_present_), (ulong)(long)local_4d8 < sVar9;
                  local_4d8 = local_4d8 + 1) {
                pvVar10 = std::
                          vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                          ::operator[]((vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                        *)&m.trun_.data_offset_present_,(long)local_4d8);
                sample_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = pvVar10->sample_size_;
                uVar6 = (ulong)sample_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                std::allocator<unsigned_char>::allocator
                          ((allocator<unsigned_char> *)((long)&bts + 3));
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j,uVar6,
                           (allocator<unsigned_char> *)((long)&bts + 3));
                std::allocator<unsigned_char>::~allocator
                          ((allocator<unsigned_char> *)((long)&bts + 3));
                poVar13 = std::operator<<((ostream *)&std::cout,
                                          "== found sample, presentation time = ");
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,_i);
                poVar13 = std::operator<<(poVar13," duration = ");
                pvVar10 = std::
                          vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                          ::operator[]((vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                        *)&m.trun_.data_offset_present_,(long)local_4d8);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pvVar10->sample_duration_);
                poVar13 = std::operator<<(poVar13," sample size = ");
                pvVar10 = std::
                          vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                          ::operator[]((vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                        *)&m.trun_.data_offset_present_,(long)local_4d8);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pvVar10->sample_size_);
                poVar13 = std::operator<<(poVar13," == ");
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                for (local_500 = 0;
                    local_500 <
                    sample_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                    local_500 = local_500 + 1) {
                  pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       (m.mdat_box_.extended_type_ + 8),(ulong)(ss + 8 + local_500))
                  ;
                  vVar1 = *pvVar11;
                  pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j,
                                       (ulong)local_500);
                  *pvVar11 = vVar1;
                }
                local_504 = 0;
                if (sample_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 9) {
                  poVar13 = std::operator<<((ostream *)&std::cout,"empty sample (embe/emeb): ");
                  std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                }
                else {
                  pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j,4
                                      );
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_528,"emib",
                             (allocator *)
                             ((long)&im_box.message_data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  bVar2 = compare_4cc((char *)pvVar11,&local_528);
                  std::__cxx11::string::~string((string *)&local_528);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&im_box.message_data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  if (bVar2) {
                    while (uVar6 = (ulong)local_504,
                          sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&j), uVar6 < sVar9) {
                      EventMessageInstanceBox::EventMessageInstanceBox
                                ((EventMessageInstanceBox *)local_608);
                      puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &j);
                      uVar6 = (ulong)local_504;
                      sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j
                                        );
                      uVar5 = EventMessageInstanceBox::parse
                                        ((EventMessageInstanceBox *)local_608,
                                         (char *)(puVar12 + uVar6),(uint)sVar9,_i);
                      local_504 = local_504 + uVar5;
                      EventMessageInstanceBox::print((EventMessageInstanceBox *)local_608);
                      EventMessageInstanceBox::~EventMessageInstanceBox
                                ((EventMessageInstanceBox *)local_608);
                    }
                  }
                  else {
                    pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j
                                         ,4);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_628,"emsg",
                               (allocator *)
                               ((long)&e_1.message_data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                    bVar2 = compare_4cc((char *)pvVar11,&local_628);
                    std::__cxx11::string::~string((string *)&local_628);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)
                               ((long)&e_1.message_data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                    if (bVar2) {
                      while (uVar6 = (ulong)local_504,
                            sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                              ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&j), uVar6 < sVar9) {
                        DASHEventMessageBoxv1::DASHEventMessageBoxv1((DASHEventMessageBoxv1 *)&e);
                        puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&j);
                        uVar6 = (ulong)local_504;
                        sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &j);
                        uVar5 = DASHEventMessageBoxv1::parse
                                          ((DASHEventMessageBoxv1 *)&e,(char *)(puVar12 + uVar6),
                                           (uint)sVar9,_i);
                        local_504 = local_504 + uVar5;
                        DASHEventMessageBoxv1::print((DASHEventMessageBoxv1 *)&e);
                        DASHEventMessageBoxv1::~DASHEventMessageBoxv1((DASHEventMessageBoxv1 *)&e);
                      }
                    }
                  }
                }
                ss = sample_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + ss;
                pvVar10 = std::
                          vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                          ::operator[]((vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                        *)&m.trun_.data_offset_present_,(long)local_4d8);
                _i = pvVar10->sample_duration_ + _i;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j);
              }
            }
          }
        }
        fmp4_stream::media_fragment::~media_fragment((media_fragment *)local_4b8);
      }
      pbVar7 = __gnu_cxx::
               __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
               ::operator->(&local_c8);
      iVar4 = std::__cxx11::string::compare((char *)&pbVar7->box_type_);
      if (iVar4 == 0) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        fmp4_stream::box::operator=(&(this->super_ingest_stream).mfra_box_,pbVar8);
      }
      pbVar7 = __gnu_cxx::
               __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
               ::operator->(&local_c8);
      iVar4 = std::__cxx11::string::compare((char *)&pbVar7->box_type_);
      if (iVar4 == 0) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        fmp4_stream::box::operator=(&(this->super_ingest_stream).sidx_box_,pbVar8);
        std::operator<<((ostream *)&std::cout,"|sidx|");
      }
      pbVar7 = __gnu_cxx::
               __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
               ::operator->(&local_c8);
      iVar4 = std::__cxx11::string::compare((char *)&pbVar7->box_type_);
      if (iVar4 == 0) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        fmp4_stream::box::operator=(&(this->super_ingest_stream).meta_box_,pbVar8);
        std::operator<<((ostream *)&std::cout,"|meta|");
      }
      __gnu_cxx::
      __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
      ::operator++(&local_c8);
    }
    it._M_current._4_4_ = 0;
LAB_0010cad6:
    std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector
              ((vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> *)&b.is_large_);
    if (it._M_current._4_4_ != 0) {
      return this_local._4_4_;
    }
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar13 = std::operator<<((ostream *)&std::cout,"***  finished reading fmp4 fragments  ***");
  std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int event_track::ingest_event_stream::print_samples_from_file(std::istream &infile, bool init_only)
{
	try
	{
		if (infile)
		{
			std::vector<box> ingest_boxes;

			while (infile.good()) // read box by box in a vector
			{
				box b = {};

				if (b.read(infile))
					ingest_boxes.push_back(b);
				else  // break when we have boxes of size zero
					break;

				if (b.box_type_.compare("mfra") == 0)
					break;
			}

			// organize the boxes in init fragments and media fragments 
			for (auto it = ingest_boxes.begin(); it != ingest_boxes.end(); ++it)
			{
				if (it->box_type_.compare("ftyp") == 0)
				{
					//cout << "|ftyp|";
					init_fragment_.ftyp_box_ = *it;
				}
				if (it->box_type_.compare("moov") == 0)
				{
					//cout << "|moov|";
					init_fragment_.moov_box_ = *it;

					if (init_only)
						return 0;
				}

				if (it->box_type_.compare("moof") == 0) // in case of moof box we push both the moof and following mdat
				{
					media_fragment m = {};
					m.moof_box_ = *it;
					m.parse_moof();
					bool mdat_found = false;
					std::cout << "==  found movie fragment with base media decode time: " << m.tfdt_.base_media_decode_time_ << std::endl;
					it++;

					// only support default base is moof and mdat immediately following (CMAF)
					if (m.tfhd_.default_base_is_moof_ && (m.trun_.data_offset_ - 8) == m.moof_box_.size_) {

						if (it->box_type_.compare("mdat") == 0)
						{
							m.mdat_box_ = *it;
							uint64_t pres_time = m.tfdt_.base_media_decode_time_;
							uint32_t data_offset = 0;

							if (m.trun_.sample_duration_present_ && m.trun_.sample_size_present_)
							{
								for (int i = 0; i < m.trun_.m_sentry.size(); i++)
								{
									uint32_t ss = m.trun_.m_sentry[i].sample_size_;
									std::vector<uint8_t> sample_data(ss);
									std::cout << "== found sample, presentation time = " << pres_time <<
										" duration = " \
										<< m.trun_.m_sentry[i].sample_duration_ << " sample size = " << m.trun_.m_sentry[i].sample_size_ << " == " << std::endl;
									for (unsigned int j = 0; j < ss; j++)
										sample_data[j] = m.mdat_box_.box_data_[8 + data_offset + j];

									//parse_event_sample(sample_data,uint64_t presentation_time, )
									unsigned int bts = 0;
									if (ss > 8)
									{
										if (compare_4cc((char *) &sample_data[4], "emib")) {
											while (bts < sample_data.size()) {
												EventMessageInstanceBox im_box;
												bts += im_box.parse((char *)sample_data.data() + bts, (unsigned int)sample_data.size(),pres_time);
												im_box.print();
											}
										}
										else if (compare_4cc((char *)&sample_data[4], "emsg"))
										{
											while (bts < sample_data.size()) 
											{
												DASHEventMessageBoxv1 e;
												bts += e.parse((char *)sample_data.data() + bts, (unsigned int) sample_data.size(),pres_time);
												e.print();
											}
										}
									}
									else
									{
										std::cout << "empty sample (embe/emeb): " << std::endl;
									}

									data_offset += ss;
									pres_time += m.trun_.m_sentry[i].sample_duration_;
								}
							}
						}
					}
					else
					{
						std::cout << "error only CMAF based metadata tracks supported with default_base_is_moof and mdat immediately following" << std::endl;
					}
				}
				if (it->box_type_.compare("mfra") == 0)
				{
					this->mfra_box_ = *it;
				}
				if (it->box_type_.compare("sidx") == 0)
				{
					this->sidx_box_ = *it;
					std::cout << "|sidx|";
				}
				if (it->box_type_.compare("meta") == 0)
				{
					this->meta_box_ = *it;
					std::cout << "|meta|";
				}
			}
		}
		std::cout << std::endl;
		std::cout << "***  finished reading fmp4 fragments  ***" << std::endl;

		return 0;
	}
	catch (std::exception e)
	{
		std::cout << e.what() << std::endl;
		return 0;
	}
}